

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O3

void icu_63::SimpleDateFormat::translatePattern
               (UnicodeString *originalPattern,UnicodeString *translatedPattern,UnicodeString *from,
               UnicodeString *to,UErrorCode *status)

{
  ushort uVar1;
  short sVar2;
  UnicodeString *pUVar3;
  ushort uVar4;
  UChar c;
  uint uVar5;
  int iVar6;
  int32_t length;
  char16_t *pcVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  UChar local_52;
  UnicodeString *local_50;
  char16_t *local_48;
  UErrorCode *local_40;
  UnicodeString *local_38;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (translatedPattern->fUnion).fStackFields.fLengthAndFlags;
    uVar4 = 2;
    if ((uVar1 & 1) == 0) {
      uVar4 = uVar1 & 0x1e;
    }
    (translatedPattern->fUnion).fStackFields.fLengthAndFlags = uVar4;
    sVar2 = (originalPattern->fUnion).fStackFields.fLengthAndFlags;
    uVar5 = (uint)sVar2;
    if (sVar2 < 0) {
      iVar6 = (originalPattern->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)uVar5 >> 5;
    }
    if (0 < iVar6) {
      local_48 = (char16_t *)((long)&to->fUnion + 2);
      lVar9 = 0;
      bVar10 = false;
      local_50 = to;
      local_40 = status;
      local_38 = from;
      do {
        pUVar3 = local_50;
        pcVar7 = (char16_t *)((long)&originalPattern->fUnion + 2);
        if ((uVar5 & 2) == 0) {
          pcVar7 = (originalPattern->fUnion).fFields.fArray;
        }
        c = pcVar7[lVar9];
        if (bVar10) {
          bVar10 = c != L'\'';
        }
        else if (c == L'\'') {
          bVar10 = true;
          c = L'\'';
        }
        else {
          if (((ushort)c < 0x80) && (""[(ushort)c] != '\0')) {
            sVar2 = (local_38->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              length = (local_38->fUnion).fFields.fLength;
            }
            else {
              length = (int)sVar2 >> 5;
            }
            uVar5 = icu_63::UnicodeString::doIndexOf(local_38,c,0,length);
            if (uVar5 == 0xffffffff) goto LAB_002c7b34;
            sVar2 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              uVar8 = (pUVar3->fUnion).fFields.fLength;
            }
            else {
              uVar8 = (int)sVar2 >> 5;
            }
            if (uVar5 < uVar8) {
              pcVar7 = local_48;
              if (((int)sVar2 & 2U) == 0) {
                pcVar7 = (pUVar3->fUnion).fFields.fArray;
              }
              c = pcVar7[(int)uVar5];
            }
            else {
              c = L'\xffff';
            }
          }
          bVar10 = false;
        }
        local_52 = c;
        icu_63::UnicodeString::doAppend(translatedPattern,&local_52,0,1);
        sVar2 = (originalPattern->fUnion).fStackFields.fLengthAndFlags;
        uVar5 = (uint)sVar2;
        if (sVar2 < 0) {
          iVar6 = (originalPattern->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)uVar5 >> 5;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar6);
      if (bVar10) {
LAB_002c7b34:
        *local_40 = U_INVALID_FORMAT_ERROR;
      }
    }
  }
  return;
}

Assistant:

void SimpleDateFormat::translatePattern(const UnicodeString& originalPattern,
                                        UnicodeString& translatedPattern,
                                        const UnicodeString& from,
                                        const UnicodeString& to,
                                        UErrorCode& status)
{
    // run through the pattern and convert any pattern symbols from the version
    // in "from" to the corresponding character in "to".  This code takes
    // quoted strings into account (it doesn't try to translate them), and it signals
    // an error if a particular "pattern character" doesn't appear in "from".
    // Depending on the values of "from" and "to" this can convert from generic
    // to localized patterns or localized to generic.
    if (U_FAILURE(status)) {
        return;
    }

    translatedPattern.remove();
    UBool inQuote = FALSE;
    for (int32_t i = 0; i < originalPattern.length(); ++i) {
        UChar c = originalPattern[i];
        if (inQuote) {
            if (c == QUOTE) {
                inQuote = FALSE;
            }
        } else {
            if (c == QUOTE) {
                inQuote = TRUE;
            } else if (isSyntaxChar(c)) {
                int32_t ci = from.indexOf(c);
                if (ci == -1) {
                    status = U_INVALID_FORMAT_ERROR;
                    return;
                }
                c = to[ci];
            }
        }
        translatedPattern += c;
    }
    if (inQuote) {
        status = U_INVALID_FORMAT_ERROR;
        return;
    }
}